

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::BfbsNamer::Denamespace<reflection::Enum_const*>
          (string *__return_storage_ptr__,BfbsNamer *this,Enum *t,string *namespace_prefix,
          char delimiter)

{
  String *pSVar1;
  allocator<char> local_49;
  string local_48;
  
  pSVar1 = reflection::Enum::name(t);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(char *)(pSVar1 + 1),&local_49);
  Namer::Denamespace(__return_storage_ptr__,&this->super_Namer,&local_48,namespace_prefix,delimiter)
  ;
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(T t, std::string &namespace_prefix,
                          const char delimiter = '.') const {
    return Namer::Denamespace(t->name()->c_str(), namespace_prefix, delimiter);
  }